

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchcharclass(char c,char *str)

{
  char cVar1;
  int iVar2;
  bool local_19;
  char *local_18;
  char *str_local;
  char c_local;
  
  local_18 = str;
  do {
    iVar2 = matchrange(c,local_18);
    if (iVar2 != 0) {
      return 1;
    }
    if (*local_18 == '\\') {
      local_18 = local_18 + 1;
      iVar2 = matchmetachar(c,local_18);
      if (iVar2 != 0) {
        return 1;
      }
      if ((c == *local_18) && (iVar2 = ismetachar(c), iVar2 == 0)) {
        return 1;
      }
    }
    else if (c == *local_18) {
      if (c == '-') {
        local_19 = true;
        if (local_18[-1] != '\0') {
          local_19 = local_18[1] == '\0';
        }
        return (uint)local_19;
      }
      return 1;
    }
    cVar1 = *local_18;
    local_18 = local_18 + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

static int matchcharclass(char c, const char* str)
{
  do
  {
    if (matchrange(c, str))
    {
      return 1;
    }
    else if (str[0] == '\\')
    {
      /* Escape-char: increment str-ptr and match on next char */
      str += 1;
      if (matchmetachar(c, str))
      {
        return 1;
      } 
      else if ((c == str[0]) && !ismetachar(c))
      {
        return 1;
      }
    }
    else if (c == str[0])
    {
      if (c == '-')
      {
        return ((str[-1] == '\0') || (str[1] == '\0'));
      }
      else
      {
        return 1;
      }
    }
  }
  while (*str++ != '\0');

  return 0;
}